

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONWorker.cpp
# Opt level: O0

void JSONWorker::NewNode(internalJSONNode *parent,json_string *name,json_string *value,bool param_4)

{
  jsonChildren *pjVar1;
  ulong uVar2;
  internalJSONNode *piVar3;
  JSONNode *pJVar4;
  allocator<char> local_71;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  json_string local_58;
  undefined1 local_21;
  json_string *pjStack_20;
  bool param_3_local;
  json_string *value_local;
  json_string *name_local;
  internalJSONNode *parent_local;
  
  local_21 = param_4;
  pjStack_20 = value;
  value_local = name;
  name_local = (json_string *)parent;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    pjVar1 = (jsonChildren *)name_local[3].field_2._M_allocated_capacity;
    local_68._M_current = (char *)std::__cxx11::string::begin();
    local_60 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator+(&local_68,1);
    local_70._M_current = (char *)std::__cxx11::string::end();
    std::allocator<char>::allocator();
    std::__cxx11::string::
    string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((string *)&local_58,local_60,local_70,&local_71);
    piVar3 = internalJSONNode::newInternal(&local_58,pjStack_20);
    pJVar4 = ::JSONNode::newJSONNode(piVar3);
    jsonChildren::push_back(pjVar1,pJVar4);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_71);
  }
  else {
    pjVar1 = (jsonChildren *)name_local[3].field_2._M_allocated_capacity;
    piVar3 = internalJSONNode::newInternal(value_local,pjStack_20);
    pJVar4 = ::JSONNode::newJSONNode(piVar3);
    jsonChildren::push_back(pjVar1,pJVar4);
  }
  return;
}

Assistant:

inline void JSONWorker::NewNode(const internalJSONNode * parent, const json_string & name, const json_string & value, ARRAY_PARAM) json_nothrow {
    #ifdef JSON_COMMENTS
	   JSONNode * child;
	   START_MEM_SCOPE
		  json_string _comment;
		  START_MEM_SCOPE
			 const json_char * runner = ((array) ? value.data() : name.data());
			 #ifdef JSON_DEBUG
				const json_char * const end = runner + value.length();
			#endif
			 if (json_unlikely(*runner == JSON_TEMP_COMMENT_IDENTIFIER)){  //multiple comments will be consolidated into one
				size_t count;
				const json_char * start;
			    newcomment:
				count = 0;
				start = runner + 1;
				while(*(++runner) != JSON_TEMP_COMMENT_IDENTIFIER){
				    JSON_ASSERT(runner != end, JSON_TEXT("Removing white space failed"));
					++count;
				}
				if (count) _comment += json_string(start, count);
				if (json_unlikely(*(++runner) == JSON_TEMP_COMMENT_IDENTIFIER)){ //step past the trailing tag
				    _comment += JSON_TEXT('\n');
				    goto newcomment;
				}
			 }
			 internalJSONNode * myinternal;
			 if (array){
				myinternal = internalJSONNode::newInternal(name, runner);
			 } else {
				myinternal = internalJSONNode::newInternal(++runner, value);
			 }
			 child = JSONNode::newJSONNode(myinternal);
		  END_MEM_SCOPE
		  child -> set_comment(_comment);
	   END_MEM_SCOPE
	   const_cast<internalJSONNode*>(parent) -> CHILDREN -> push_back(child);   //attach it to the parent node
    #else
	if (name.empty()){
	   	const_cast<internalJSONNode*>(parent) -> CHILDREN -> push_back(JSONNode::newJSONNode(internalJSONNode::newInternal(name, value)));	    //attach it to the parent node
	} else {
		const_cast<internalJSONNode*>(parent) -> CHILDREN -> push_back(JSONNode::newJSONNode(internalJSONNode::newInternal(json_string(name.begin() + 1, name.end()), value)));	    //attach it to the parent node
	}
    #endif
}